

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupByState.hpp
# Opt level: O0

void __thiscall
linq::
GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_&>_>,_bool,_int>
::Init(GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_&>_>,_bool,_int>
       *this)

{
  bool bVar1;
  mapped_type *this_00;
  iterator iVar2;
  key_type_conflict local_99;
  int *local_98;
  int *x;
  undefined1 local_68 [8];
  iterator __end0;
  iterator __begin0;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_&>_> *__range2;
  GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_&>_>,_bool,_int>
  *this_local;
  
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_&>_>::Init
            (&this->source);
  std::
  map<bool,_std::vector<int,_std::allocator<int>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear(&this->result);
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_&>_>::begin
            ((iterator *)&__end0.valid,&this->source);
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_&>_>::end
            ((iterator *)local_68,&this->source);
  while( true ) {
    IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_&>_>::iterator
    ::iterator((iterator *)&x,(iterator *)local_68);
    bVar1 = IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_&>_>::
            iterator::operator!=((iterator *)&__end0.valid,(iterator *)&x);
    if (!bVar1) break;
    local_98 = IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_&>_>
               ::iterator::operator*((iterator *)&__end0.valid);
    local_99 = std::function<bool_(const_int_&)>::operator()(&this->transformer,local_98);
    this_00 = std::
              map<bool,_std::vector<int,_std::allocator<int>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](&this->result,&local_99);
    std::vector<int,_std::allocator<int>_>::push_back(this_00,local_98);
    IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_&>_>::iterator
    ::operator++((iterator *)&__end0.valid);
  }
  iVar2 = std::
          map<bool,_std::vector<int,_std::allocator<int>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::begin(&this->result);
  (this->current)._M_node = iVar2._M_node;
  return;
}

Assistant:

void Init() override 
			{
				source.Init();
				result.clear();
				
				for(const auto& x : source)
					result[transformer(x)].push_back(x);
				
				current = result.begin();
			}